

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O3

BCPos debug_framepc(lua_State *L,GCfunc *fn,cTValue *nextframe)

{
  BCPos BVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  cTValue *pcVar5;
  
  BVar1 = 0xffffffff;
  if ((fn->c).ffid == '\0') {
    if (nextframe == (cTValue *)0x0) {
      uVar3 = (ulong)L->cframe & 0xfffffffffffffffc;
      if (uVar3 == 0) {
        return 0xffffffff;
      }
      uVar2 = *(uint *)(uVar3 + 0x1c);
      if (uVar2 == *(uint *)(uVar3 + 0x18)) {
        return 0xffffffff;
      }
    }
    else {
      uVar2 = (nextframe->field_2).it;
      if ((uVar2 & 3) != 0) {
        if ((uVar2 & 7) == 2) {
          uVar2 = *(uint *)((long)nextframe + -4);
        }
        else {
          uVar3 = (ulong)L->cframe & 0xfffffffffffffffc;
          if (uVar3 == 0) {
            return 0xffffffff;
          }
          pcVar5 = L->base + -1;
          while( true ) {
            while ((*(int *)(uVar3 + 0x10) < 0 &&
                   (pcVar5 < (cTValue *)
                             ((ulong)(uint)-*(int *)(uVar3 + 0x10) + (ulong)(L->stack).ptr32)))) {
              uVar3 = *(ulong *)(uVar3 + 0x30) & 0xfffffffffffffffc;
              if (uVar3 == 0) {
                return 0xffffffff;
              }
            }
            if (pcVar5 < nextframe) break;
            uVar2 = (pcVar5->field_2).it;
            if ((uVar2 & 3) == 1) {
LAB_00111988:
              uVar3 = *(ulong *)(uVar3 + 0x30) & 0xfffffffffffffffc;
LAB_00111990:
              pcVar5 = (cTValue *)((long)pcVar5 - (long)(int)(uVar2 & 0xfffffff8));
            }
            else {
              if ((uVar2 & 3) != 0) {
                if (((uVar2 & 7) == 2) && (pcVar5[-1].u32.lo == 1)) goto LAB_00111988;
                goto LAB_00111990;
              }
              pcVar5 = pcVar5 + (-1 - (ulong)*(byte *)((ulong)uVar2 - 3));
            }
            if (uVar3 == 0) {
              return 0xffffffff;
            }
          }
          uVar2 = *(uint *)(uVar3 + 0x1c);
          if (uVar2 == 0) {
            return 0xffffffff;
          }
        }
      }
    }
    uVar4 = (ulong)uVar2;
    uVar3 = (ulong)(fn->c).pc.ptr32;
    BVar1 = (int)(uVar4 - uVar3 >> 2) - 1;
    if ((*(uint *)(uVar3 - 0x38) < BVar1) &&
       (BVar1 = 0xffffffff, 0xfffffffb < *(byte *)(uVar4 - 4) - 0x4d)) {
      return (BCPos)(*(uint *)(uVar4 - 8) - uVar3 >> 2);
    }
  }
  return BVar1;
}

Assistant:

static BCPos debug_framepc(lua_State *L, GCfunc *fn, cTValue *nextframe)
{
  const BCIns *ins;
  GCproto *pt;
  BCPos pos;
  lj_assertL(fn->c.gct == ~LJ_TFUNC || fn->c.gct == ~LJ_TTHREAD,
	     "function or frame expected");
  if (!isluafunc(fn)) {  /* Cannot derive a PC for non-Lua functions. */
    return NO_BCPOS;
  } else if (nextframe == NULL) {  /* Lua function on top. */
    void *cf = cframe_raw(L->cframe);
    if (cf == NULL || (char *)cframe_pc(cf) == (char *)cframe_L(cf))
      return NO_BCPOS;
    ins = cframe_pc(cf);  /* Only happens during error/hook handling. */
  } else {
    if (frame_islua(nextframe)) {
      ins = frame_pc(nextframe);
    } else if (frame_iscont(nextframe)) {
      ins = frame_contpc(nextframe);
    } else {
      /* Lua function below errfunc/gc/hook: find cframe to get the PC. */
      void *cf = cframe_raw(L->cframe);
      TValue *f = L->base-1;
      for (;;) {
	if (cf == NULL)
	  return NO_BCPOS;
	while (cframe_nres(cf) < 0) {
	  if (f >= restorestack(L, -cframe_nres(cf)))
	    break;
	  cf = cframe_raw(cframe_prev(cf));
	  if (cf == NULL)
	    return NO_BCPOS;
	}
	if (f < nextframe)
	  break;
	if (frame_islua(f)) {
	  f = frame_prevl(f);
	} else {
	  if (frame_isc(f) || (frame_iscont(f) && frame_iscont_fficb(f)))
	    cf = cframe_raw(cframe_prev(cf));
	  f = frame_prevd(f);
	}
      }
      ins = cframe_pc(cf);
      if (!ins) return NO_BCPOS;
    }
  }
  pt = funcproto(fn);
  pos = proto_bcpos(pt, ins) - 1;
#if LJ_HASJIT
  if (pos > pt->sizebc) {  /* Undo the effects of lj_trace_exit for JLOOP. */
    if (bc_isret(bc_op(ins[-1]))) {
      GCtrace *T = (GCtrace *)((char *)(ins-1) - offsetof(GCtrace, startins));
      pos = proto_bcpos(pt, mref(T->startpc, const BCIns));
    } else {
      pos = NO_BCPOS;  /* Punt in case of stack overflow for stitched trace. */
    }
  }
#endif
  return pos;
}